

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
          (String *__return_storage_ptr__,detail *this,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *lhs,char *op,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *rhs)

{
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *in;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toStream<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
            (&local_48,this,lhs);
  String::String(&local_60,(char *)lhs);
  doctest::operator+(&local_30,&local_48,&local_60);
  toStream<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
            (&SStack_78,(detail *)op,in);
  doctest::operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }